

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener.cpp
# Opt level: O1

void alListenerf(ALenum param,ALfloat value)

{
  int iVar1;
  char *msg;
  ALenum errorCode;
  ContextRef context;
  ALCcontext *local_28;
  
  GetContextRef();
  if (local_28 == (ALCcontext *)0x0) goto LAB_001218b3;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&local_28->mPropLock);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  if (param == 0x100a) {
    if ((0x7effffff < (int)ABS(value) - 0x800000U || (int)value < 0) &&
        (ABS(value) != 0.0 && 0x7ffffe < (int)value - 1U)) {
      msg = "Listener gain out of range";
      errorCode = 0xa003;
      goto LAB_001218a0;
    }
    (local_28->mListener).Gain = value;
LAB_0012186e:
    if (((local_28->mDeferUpdates)._M_base._M_i & 1U) == 0) {
      UpdateListenerProps(local_28);
    }
    else {
      (local_28->mListener).PropsClean.super___atomic_flag_base._M_i = false;
    }
  }
  else {
    if (param == 0x20004) {
      msg = "Listener meters per unit out of range";
      errorCode = 0xa003;
      if ((1.1754944e-38 <= value) && (value <= 3.4028235e+38)) {
        (local_28->mListener).mMetersPerUnit = value;
        goto LAB_0012186e;
      }
    }
    else {
      msg = "Invalid listener float property";
      errorCode = 0xa002;
    }
LAB_001218a0:
    ALCcontext::setError(local_28,errorCode,msg);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&local_28->mPropLock);
LAB_001218b3:
  if (local_28 != (ALCcontext *)0x0) {
    al::intrusive_ref<ALCcontext>::release(&local_28->super_intrusive_ref<ALCcontext>);
  }
  return;
}

Assistant:

AL_API void AL_APIENTRY alListenerf(ALenum param, ALfloat value)
START_API_FUNC
{
    ContextRef context{GetContextRef()};
    if UNLIKELY(!context) return;

    ALlistener &listener = context->mListener;
    std::lock_guard<std::mutex> _{context->mPropLock};
    switch(param)
    {
    case AL_GAIN:
        if(!(value >= 0.0f && std::isfinite(value)))
            SETERR_RETURN(context, AL_INVALID_VALUE,, "Listener gain out of range");
        listener.Gain = value;
        DO_UPDATEPROPS();
        break;

    case AL_METERS_PER_UNIT:
        if(!(value >= AL_MIN_METERS_PER_UNIT && value <= AL_MAX_METERS_PER_UNIT))
            SETERR_RETURN(context, AL_INVALID_VALUE,, "Listener meters per unit out of range");
        listener.mMetersPerUnit = value;
        DO_UPDATEPROPS();
        break;

    default:
        context->setError(AL_INVALID_ENUM, "Invalid listener float property");
    }
}